

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall
cmGeneratorTarget::GetAppleArchs
          (cmGeneratorTarget *this,string *config,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *archVec)

{
  cmTarget *this_00;
  char *pcVar1;
  string defVarName;
  string sStack_58;
  string local_38;
  
  if (config->_M_string_length != 0) {
    std::__cxx11::string::string((string *)&sStack_58,"OSX_ARCHITECTURES_",(allocator *)&local_38);
    cmsys::SystemTools::UpperCase(&local_38,config);
    std::__cxx11::string::append((string *)&sStack_58);
    std::__cxx11::string::~string((string *)&local_38);
    pcVar1 = cmTarget::GetProperty(this->Target,&sStack_58);
    std::__cxx11::string::~string((string *)&sStack_58);
    if (pcVar1 != (char *)0x0) goto LAB_003b01f2;
  }
  this_00 = this->Target;
  std::__cxx11::string::string((string *)&sStack_58,"OSX_ARCHITECTURES",(allocator *)&local_38);
  pcVar1 = cmTarget::GetProperty(this_00,&sStack_58);
  std::__cxx11::string::~string((string *)&sStack_58);
  if (pcVar1 == (char *)0x0) {
    return;
  }
LAB_003b01f2:
  std::__cxx11::string::string((string *)&sStack_58,pcVar1,(allocator *)&local_38);
  cmSystemTools::ExpandListArgument(&sStack_58,archVec,false);
  std::__cxx11::string::~string((string *)&sStack_58);
  return;
}

Assistant:

void cmGeneratorTarget::GetAppleArchs(const std::string& config,
                             std::vector<std::string>& archVec) const
{
  const char* archs = 0;
  if(!config.empty())
    {
    std::string defVarName = "OSX_ARCHITECTURES_";
    defVarName += cmSystemTools::UpperCase(config);
    archs = this->Target->GetProperty(defVarName);
    }
  if(!archs)
    {
    archs = this->Target->GetProperty("OSX_ARCHITECTURES");
    }
  if(archs)
    {
    cmSystemTools::ExpandListArgument(std::string(archs), archVec);
    }
}